

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTuple.cpp
# Opt level: O0

Array<char,_void_(*)(char_*,_unsigned_long)> * __thiscall
Corrade::Containers::ArrayTuple::operator_cast_to_Array
          (Array<char,_void_(*)(char_*,_unsigned_long)> *__return_storage_ptr__,ArrayTuple *this)

{
  _func_void_char_ptr_unsigned_long *deleter_00;
  size_t size_00;
  ostream *output;
  char *data;
  size_t size;
  Deleter deleter;
  Flags local_41;
  Error local_40;
  ArrayTuple *local_18;
  ArrayTuple *this_local;
  
  local_18 = this;
  this_local = (ArrayTuple *)__return_storage_ptr__;
  if (this->_deleter == anon_unknown_2::arrayTupleDeleter) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Utility::Error::Error(&local_40,output,local_41);
    Utility::Debug::operator<<
              (&local_40.super_Debug,
               "Containers::ArrayTuple: conversion to Array allowed only with trivially destructible types and a stateless destructor"
              );
    Utility::Error::~Error(&local_40);
    abort();
  }
  deleter_00 = (_func_void_char_ptr_unsigned_long *)this->_deleter;
  size_00 = this->_size;
  data = release(this);
  Array<char,_void_(*)(char_*,_unsigned_long)>::Array
            (__return_storage_ptr__,data,size_00,deleter_00);
  return __return_storage_ptr__;
}

Assistant:

ArrayTuple::operator Array<char>() && {
    CORRADE_ASSERT(_deleter != arrayTupleDeleter,
        "Containers::ArrayTuple: conversion to Array allowed only with trivially destructible types and a stateless destructor", {});
    const Deleter deleter = _deleter;
    const std::size_t size = _size;
    return Array<char>{release(), size, deleter};
}